

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O2

bool DoGroupForOne(AActor *victim,AActor *source,AActor *dest,bool floorz,bool fog)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  undefined7 in_register_00000009;
  double dVar7;
  double dVar8;
  double dVar9;
  DAngle local_50;
  undefined1 local_48 [16];
  double local_38;
  
  dVar7 = (dest->Angles).Yaw.Degrees - (source->Angles).Yaw.Degrees;
  dVar8 = (victim->__Pos).X;
  dVar9 = (victim->__Pos).Y;
  dVar4 = (source->__Pos).X;
  dVar5 = (source->__Pos).Y;
  dVar1 = fastcosdeg(dVar7);
  dVar2 = fastsindeg(dVar7);
  dVar3 = fastsindeg(dVar7);
  dVar7 = fastcosdeg(dVar7);
  if ((int)CONCAT71(in_register_00000009,floorz) == 0) {
    local_38 = ((dest->__Pos).Z + (victim->__Pos).Z) - (source->__Pos).Z;
  }
  else {
    local_38 = -2147483648.0;
  }
  dVar8 = dVar8 - dVar4;
  dVar9 = dVar9 - dVar5;
  dVar3 = (dest->__Pos).Y + dVar8 * dVar3 + dVar7 * dVar9;
  local_48._8_4_ = SUB84(dVar3,0);
  local_48._0_8_ = (dest->__Pos).X + (dVar1 * dVar8 - dVar9 * dVar2);
  local_48._12_4_ = (int)((ulong)dVar3 >> 0x20);
  local_50.Degrees = 0.0;
  bVar6 = P_Teleport(victim,(DVector3 *)local_48,&local_50,4 - (uint)fog);
  (victim->Angles).Yaw.Degrees =
       (double)((ulong)((((victim->Angles).Yaw.Degrees + (dest->Angles).Yaw.Degrees) -
                        (source->Angles).Yaw.Degrees) * 11930464.711111112 + 6755399441055744.0) &
               0xffffffff) * 8.381903171539307e-08;
  return bVar6;
}

Assistant:

static bool DoGroupForOne (AActor *victim, AActor *source, AActor *dest, bool floorz, bool fog)
{
	DAngle an = dest->Angles.Yaw - source->Angles.Yaw;
	DVector2 off = victim->Pos() - source->Pos();
	DAngle offAngle = victim->Angles.Yaw - source->Angles.Yaw;
	DVector2 newp = { off.X * an.Cos() - off.Y * an.Sin(), off.X * an.Sin() + off.Y * an.Cos() };
	double z = floorz ? ONFLOORZ : dest->Z() + victim->Z() - source->Z();

	bool res =
		P_Teleport (victim, DVector3(dest->Pos().XY() + newp, z),
							0., fog ? (TELF_DESTFOG | TELF_SOURCEFOG) : TELF_KEEPORIENTATION);
	// P_Teleport only changes angle if fog is true
	victim->Angles.Yaw = (dest->Angles.Yaw + victim->Angles.Yaw - source->Angles.Yaw).Normalized360();

	return res;
}